

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O0

void malloc_conf_init_helper
               (sc_data_t *sc_data,uint *bin_shard_sizes,_Bool initial_call,char **opts_cache,
               char *buf)

{
  bool bVar1;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  char *pcVar5;
  ssize_t sVar6;
  size_t sVar7;
  long in_RCX;
  byte in_DL;
  int i_4;
  _Bool match_3;
  size_t pgs;
  size_t slab_end;
  size_t slab_start;
  size_t vlen_left_1;
  char *slab_size_segment_cur;
  _Bool err_1;
  char *end_6;
  uintmax_t um_3;
  int i_3;
  _Bool match_2;
  char *end_5;
  uintmax_t um_2;
  char *end_4;
  uintmax_t um_1;
  char *end_3;
  long l_2;
  char *end_2;
  long l_1;
  char *end_1;
  long l;
  _Bool err;
  size_t nshards;
  size_t size_end;
  size_t size_start;
  size_t vlen_left;
  char *bin_shards_segment_cur;
  char *end;
  uintmax_t um;
  _Bool match_1;
  int i_2;
  _Bool match;
  int i_1;
  _Bool cur_opt_valid;
  size_t vlen;
  size_t klen;
  char *v;
  char *k;
  char *opts;
  uint i;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  size_t *in_stack_fffffffffffffe68;
  size_t *in_stack_fffffffffffffe70;
  undefined6 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7e;
  byte bVar8;
  sc_data_t *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  char **in_stack_fffffffffffffe90;
  thp_mode_t in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  int in_stack_fffffffffffffea4;
  char **in_stack_fffffffffffffea8;
  char *in_stack_fffffffffffffeb0;
  long local_130;
  percpu_arena_mode_t local_120;
  long local_118;
  long local_108;
  char *local_f8;
  long local_f0;
  char *local_e8;
  char *local_d8;
  long local_d0;
  undefined1 local_c1;
  ulong local_a8;
  char *local_a0;
  long local_98;
  uintmax_t local_90;
  byte local_81;
  dss_prec_t local_80;
  byte local_79;
  metadata_thp_mode_t local_78;
  byte local_71;
  ulong local_70;
  ulong local_68;
  char *local_60;
  char *local_58;
  sc_data_t *local_50;
  uint local_44;
  long local_38;
  byte local_29;
  
  local_29 = in_DL & 1;
  local_44 = 0;
  local_38 = in_RCX;
  do {
    if (3 < local_44) {
      log_init_done.repr = true;
      return;
    }
    if ((local_29 & 1) != 0) {
      pcVar5 = obtain_malloc_conf((uint)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88));
      *(char **)(local_38 + (ulong)local_44 * 8) = pcVar5;
    }
    local_50 = *(sc_data_t **)(local_38 + (ulong)local_44 * 8);
    if (((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) {
      in_stack_fffffffffffffe8c = local_44 + 1;
      in_stack_fffffffffffffe90 = (char **)malloc_conf_init_helper::opts_explain[local_44];
      in_stack_fffffffffffffe80 = local_50;
      if (local_50 == (sc_data_t *)0x0) {
        in_stack_fffffffffffffe80 = (sc_data_t *)0x27d430;
      }
      malloc_printf("<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",(ulong)in_stack_fffffffffffffe8c,
                    in_stack_fffffffffffffe90,in_stack_fffffffffffffe80);
    }
    if (local_50 != (sc_data_t *)0x0) {
      while( true ) {
        bVar8 = 0;
        if ((char)local_50->ntiny != '\0') {
          _Var3 = malloc_conf_next((char **)CONCAT44(in_stack_fffffffffffffe9c,
                                                     in_stack_fffffffffffffe98),
                                   in_stack_fffffffffffffe90,
                                   (size_t *)
                                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                                   (char **)in_stack_fffffffffffffe80,
                                   (size_t *)
                                   (ulong)CONCAT16(in_stack_fffffffffffffe7e,
                                                   in_stack_fffffffffffffe78));
          bVar8 = _Var3 ^ 0xff;
        }
        if ((bVar8 & 1) == 0) break;
        local_71 = 1;
        if ((local_68 == 0xc) && (iVar4 = strncmp("confirm_conf",local_58,0xc), iVar4 == 0)) {
          if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
            opt_confirm_conf = true;
          }
          else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
            opt_confirm_conf = false;
          }
          else if ((local_29 & 1) == 0) {
            malloc_conf_error((char *)in_stack_fffffffffffffe90,
                              (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                              (size_t)in_stack_fffffffffffffe80,
                              (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                              in_stack_fffffffffffffe78)),
                              (size_t)in_stack_fffffffffffffe70);
            local_71 = 0;
          }
          if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) && ((local_71 & 1) != 0)) {
            malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,local_58,
                          local_70 & 0xffffffff,local_60);
          }
        }
        else if ((local_29 & 1) == 0) {
          if ((local_68 == 5) && (iVar4 = strncmp("abort",local_58,5), iVar4 == 0)) {
            if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
              opt_abort = true;
            }
            else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
              opt_abort = false;
            }
            else if ((local_29 & 1) == 0) {
              malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),(size_t)in_stack_fffffffffffffe80,
                                (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                in_stack_fffffffffffffe78)),
                                (size_t)in_stack_fffffffffffffe70);
              local_71 = 0;
            }
            if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) && ((local_71 & 1) != 0))
            {
              malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,local_58
                            ,local_70 & 0xffffffff,local_60);
            }
          }
          else if ((local_68 == 10) && (iVar4 = strncmp("abort_conf",local_58,10), iVar4 == 0)) {
            if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
              opt_abort_conf = true;
            }
            else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
              opt_abort_conf = false;
            }
            else if ((local_29 & 1) == 0) {
              malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88
                                                ),(size_t)in_stack_fffffffffffffe80,
                                (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                in_stack_fffffffffffffe78)),
                                (size_t)in_stack_fffffffffffffe70);
              local_71 = 0;
            }
            if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) && ((local_71 & 1) != 0))
            {
              malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,local_58
                            ,local_70 & 0xffffffff,local_60);
            }
          }
          else {
            iVar4 = strncmp("metadata_thp",local_58,local_68);
            if (iVar4 == 0) {
              local_79 = 0;
              for (local_78 = metadata_thp_disabled; (int)local_78 < 3;
                  local_78 = local_78 + metadata_thp_auto) {
                iVar4 = strncmp(metadata_thp_mode_names[(int)local_78],local_60,local_70);
                if (iVar4 == 0) {
                  opt_metadata_thp = local_78;
                  local_79 = 1;
                  break;
                }
              }
              if (((local_79 & 1) == 0) && ((local_29 & 1) == 0)) {
                malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),
                                  (size_t)in_stack_fffffffffffffe80,
                                  (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                  in_stack_fffffffffffffe78)),
                                  (size_t)in_stack_fffffffffffffe70);
                local_71 = 0;
              }
              if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) && ((local_71 & 1) != 0)
                 ) {
                malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                              local_58,local_70 & 0xffffffff,local_60);
              }
            }
            else if ((local_68 == 6) && (iVar4 = strncmp("retain",local_58,6), iVar4 == 0)) {
              if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                opt_retain = true;
              }
              else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                opt_retain = false;
              }
              else if ((local_29 & 1) == 0) {
                malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                  (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                   in_stack_fffffffffffffe88),
                                  (size_t)in_stack_fffffffffffffe80,
                                  (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                  in_stack_fffffffffffffe78)),
                                  (size_t)in_stack_fffffffffffffe70);
                local_71 = 0;
              }
              if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) && ((local_71 & 1) != 0)
                 ) {
                malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                              local_58,local_70 & 0xffffffff,local_60);
              }
            }
            else {
              iVar4 = strncmp("dss",local_58,local_68);
              if (iVar4 == 0) {
                local_81 = 0;
                for (local_80 = dss_prec_disabled; (int)local_80 < 3;
                    local_80 = local_80 + dss_prec_primary) {
                  iVar4 = strncmp(dss_prec_names[(int)local_80],local_60,local_70);
                  if (iVar4 == 0) {
                    _Var3 = extent_dss_prec_set(local_80);
                    if (!_Var3) {
                      opt_dss = dss_prec_names[(int)local_80];
                      local_81 = 1;
                      break;
                    }
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                    }
                  }
                }
                if (((local_81 & 1) == 0) && ((local_29 & 1) == 0)) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 7) && (iVar4 = strncmp("narenas",local_58,7), iVar4 == 0)) {
                set_errno(0);
                local_90 = malloc_strtoumax(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                            in_stack_fffffffffffffea4);
                iVar4 = get_errno();
                if ((iVar4 == 0) && (local_98 - (long)local_60 == local_70)) {
                  if (local_90 == 0) {
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                    }
                  }
                  else {
                    opt_narenas = (uint)local_90;
                  }
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 10) && (iVar4 = strncmp("bin_shards",local_58,10), iVar4 == 0))
              {
                local_a0 = local_60;
                local_a8 = local_70;
                do {
                  local_c1 = malloc_conf_multi_sizes_next
                                       ((char **)CONCAT44(in_stack_fffffffffffffe8c,
                                                          in_stack_fffffffffffffe88),
                                        (size_t *)in_stack_fffffffffffffe80,
                                        (size_t *)
                                        CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                in_stack_fffffffffffffe78)),
                                        in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
                  if (((bool)local_c1) ||
                     (_Var3 = bin_update_shard_size
                                        ((uint *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                         in_stack_fffffffffffffe78))
                                         ,(size_t)in_stack_fffffffffffffe70,
                                         (size_t)in_stack_fffffffffffffe68,
                                         CONCAT44(in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60)), _Var3)) {
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                    }
                    break;
                  }
                } while (local_a8 != 0);
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0xe) &&
                      (iVar4 = strncmp("dirty_decay_ms",local_58,0xe), iVar4 == 0)) {
                set_errno(0);
                local_d0 = strtol(local_60,&local_d8,0);
                iVar4 = get_errno();
                if ((iVar4 == 0) && ((long)local_d8 - (long)local_60 == local_70)) {
                  if ((local_d0 < -1) || (0x10c6f7a0af40 < local_d0)) {
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                    }
                  }
                  else {
                    opt_dirty_decay_ms = local_d0;
                  }
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0xe) &&
                      (iVar4 = strncmp("muzzy_decay_ms",local_58,0xe), iVar4 == 0)) {
                set_errno(0);
                sVar6 = strtol(local_60,&local_e8,0);
                iVar4 = get_errno();
                if ((iVar4 == 0) && ((long)local_e8 - (long)local_60 == local_70)) {
                  if (((sVar6 < -1) || (0x10c6f7a0af40 < sVar6)) &&
                     (sVar6 = opt_muzzy_decay_ms, (local_29 & 1) == 0)) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar6 = opt_muzzy_decay_ms;
                  }
                }
                else {
                  sVar6 = opt_muzzy_decay_ms;
                  if ((local_29 & 1) == 0) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar6 = opt_muzzy_decay_ms;
                  }
                }
                opt_muzzy_decay_ms = sVar6;
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0xb) &&
                      (iVar4 = strncmp("stats_print",local_58,0xb), iVar4 == 0)) {
                if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                  opt_stats_print = true;
                }
                else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                  opt_stats_print = false;
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0x10) &&
                      (iVar4 = strncmp("stats_print_opts",local_58,0x10), iVar4 == 0)) {
                init_opt_stats_print_opts
                          ((char *)in_stack_fffffffffffffe70,(size_t)in_stack_fffffffffffffe68);
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 4) && (iVar4 = strncmp("junk",local_58,4), iVar4 == 0)) {
                if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                  opt_junk = "true";
                  opt_junk_free = true;
                  opt_junk_alloc = true;
                }
                else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                  opt_junk = "false";
                  opt_junk_free = false;
                  opt_junk_alloc = false;
                }
                else if ((local_70 == 5) && (iVar4 = strncmp("alloc",local_60,5), iVar4 == 0)) {
                  opt_junk = "alloc";
                  opt_junk_alloc = true;
                  opt_junk_free = false;
                }
                else if ((local_70 == 4) && (iVar4 = strncmp("free",local_60,4), iVar4 == 0)) {
                  opt_junk = "free";
                  opt_junk_alloc = false;
                  opt_junk_free = true;
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 4) && (iVar4 = strncmp("zero",local_58,4), iVar4 == 0)) {
                if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                  opt_zero = true;
                }
                else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                  opt_zero = false;
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 6) && (iVar4 = strncmp("tcache",local_58,6), iVar4 == 0)) {
                if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                  opt_tcache = true;
                }
                else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                  opt_tcache = false;
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0xd) &&
                      (iVar4 = strncmp("lg_tcache_max",local_58,0xd), iVar4 == 0)) {
                set_errno(0);
                local_f0 = strtol(local_60,&local_f8,0);
                iVar4 = get_errno();
                if ((iVar4 == 0) && ((long)local_f8 - (long)local_60 == local_70)) {
                  if ((local_f0 < -1) || (0x3f < local_f0)) {
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                    }
                  }
                  else {
                    opt_lg_tcache_max = local_f0;
                  }
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0x12) &&
                      (iVar4 = strncmp("oversize_threshold",local_58,0x12), iVar4 == 0)) {
                set_errno(0);
                sVar7 = malloc_strtoumax(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                         in_stack_fffffffffffffea4);
                iVar4 = get_errno();
                if ((iVar4 == 0) && (local_108 - (long)local_60 == local_70)) {
                  if ((0x7000000000000000 < sVar7) &&
                     (sVar7 = opt_oversize_threshold, (local_29 & 1) == 0)) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar7 = opt_oversize_threshold;
                  }
                }
                else {
                  sVar7 = opt_oversize_threshold;
                  if ((local_29 & 1) == 0) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar7 = opt_oversize_threshold;
                  }
                }
                opt_oversize_threshold = sVar7;
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else if ((local_68 == 0x18) &&
                      (iVar4 = strncmp("lg_extent_max_active_fit",local_58,0x18), iVar4 == 0)) {
                set_errno(0);
                sVar7 = malloc_strtoumax(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                         in_stack_fffffffffffffea4);
                iVar4 = get_errno();
                if ((iVar4 == 0) && (local_118 - (long)local_60 == local_70)) {
                  if ((0x40 < sVar7) && (sVar7 = opt_lg_extent_max_active_fit, (local_29 & 1) == 0))
                  {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar7 = opt_lg_extent_max_active_fit;
                  }
                }
                else {
                  sVar7 = opt_lg_extent_max_active_fit;
                  if ((local_29 & 1) == 0) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                    sVar7 = opt_lg_extent_max_active_fit;
                  }
                }
                opt_lg_extent_max_active_fit = sVar7;
                if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                   ((local_71 & 1) != 0)) {
                  malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                local_58,local_70 & 0xffffffff,local_60);
                }
              }
              else {
                iVar4 = strncmp("percpu_arena",local_58,local_68);
                if (iVar4 == 0) {
                  bVar1 = false;
                  for (local_120 = percpu_arena_mode_names_base; (int)local_120 < 3;
                      local_120 = local_120 + per_phycpu_arena_uninit) {
                    iVar4 = strncmp(percpu_arena_mode_names[(int)local_120],local_60,local_70);
                    if (iVar4 == 0) {
                      opt_percpu_arena = local_120;
                      bVar1 = true;
                      break;
                    }
                  }
                  if ((!bVar1) && ((local_29 & 1) == 0)) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                  }
                  if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                     ((local_71 & 1) != 0)) {
                    malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                  local_58,local_70 & 0xffffffff,local_60);
                  }
                }
                else if ((local_68 == 0x11) &&
                        (iVar4 = strncmp("background_thread",local_58,0x11), iVar4 == 0)) {
                  if ((local_70 == 4) && (iVar4 = strncmp("true",local_60,4), iVar4 == 0)) {
                    opt_background_thread = true;
                  }
                  else if ((local_70 == 5) && (iVar4 = strncmp("false",local_60,5), iVar4 == 0)) {
                    opt_background_thread = false;
                  }
                  else if ((local_29 & 1) == 0) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                  }
                  if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                     ((local_71 & 1) != 0)) {
                    malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                  local_58,local_70 & 0xffffffff,local_60);
                  }
                }
                else if ((local_68 == 0x16) &&
                        (iVar4 = strncmp("max_background_threads",local_58,0x16), iVar4 == 0)) {
                  set_errno(0);
                  sVar7 = malloc_strtoumax(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                                           in_stack_fffffffffffffea4);
                  iVar4 = get_errno();
                  if ((iVar4 == 0) && (local_130 - (long)local_60 == local_70)) {
                    if (sVar7 == 0) {
                      opt_max_background_threads = 1;
                      sVar7 = opt_max_background_threads;
                    }
                    else if (opt_max_background_threads < sVar7) {
                      sVar7 = opt_max_background_threads;
                    }
                  }
                  else {
                    sVar7 = opt_max_background_threads;
                    if ((local_29 & 1) == 0) {
                      malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                        (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                        (size_t)in_stack_fffffffffffffe80,
                                        (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                        in_stack_fffffffffffffe78)),
                                        (size_t)in_stack_fffffffffffffe70);
                      local_71 = 0;
                      sVar7 = opt_max_background_threads;
                    }
                  }
                  opt_max_background_threads = sVar7;
                  if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                     ((local_71 & 1) != 0)) {
                    malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                  local_58,local_70 & 0xffffffff,local_60);
                  }
                }
                else if ((local_68 == 10) &&
                        (iVar4 = strncmp("slab_sizes",local_58,10), uVar2 = local_70, iVar4 == 0)) {
                  do {
                    _Var3 = malloc_conf_multi_sizes_next
                                      ((char **)CONCAT44(in_stack_fffffffffffffe8c,
                                                         in_stack_fffffffffffffe88),
                                       (size_t *)in_stack_fffffffffffffe80,
                                       (size_t *)
                                       CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                               in_stack_fffffffffffffe78)),
                                       in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
                    if (_Var3) {
                      if ((local_29 & 1) == 0) {
                        malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                          (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                           in_stack_fffffffffffffe88),
                                          (size_t)in_stack_fffffffffffffe80,
                                          (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                          in_stack_fffffffffffffe78)
                                                          ),(size_t)in_stack_fffffffffffffe70);
                        local_71 = 0;
                      }
                    }
                    else {
                      sc_data_update_slab_size
                                (in_stack_fffffffffffffe80,
                                 CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                         in_stack_fffffffffffffe78)),
                                 (size_t)in_stack_fffffffffffffe70,
                                 (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
                    }
                    in_stack_fffffffffffffe7e = !_Var3 && uVar2 != 0;
                  } while ((bool)in_stack_fffffffffffffe7e);
                  if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                     ((local_71 & 1) != 0)) {
                    malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                  local_58,local_70 & 0xffffffff,local_60);
                  }
                }
                else if ((local_68 == 3) && (iVar4 = strncmp("thp",local_58,3), iVar4 == 0)) {
                  in_stack_fffffffffffffe9c = in_stack_fffffffffffffe9c & 0xffffff;
                  for (in_stack_fffffffffffffe98 = thp_mode_default;
                      (int)in_stack_fffffffffffffe98 < 3;
                      in_stack_fffffffffffffe98 = in_stack_fffffffffffffe98 + thp_mode_always) {
                    iVar4 = strncmp(thp_mode_names[(int)in_stack_fffffffffffffe98],local_60,local_70
                                   );
                    if (iVar4 == 0) {
                      in_stack_fffffffffffffe9c = CONCAT13(1,(int3)in_stack_fffffffffffffe9c);
                      opt_thp = in_stack_fffffffffffffe98;
                      break;
                    }
                  }
                  if (((in_stack_fffffffffffffe9c & 0x1000000) == 0) && ((local_29 & 1) == 0)) {
                    malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                      (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                       in_stack_fffffffffffffe88),
                                      (size_t)in_stack_fffffffffffffe80,
                                      (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                      in_stack_fffffffffffffe78)),
                                      (size_t)in_stack_fffffffffffffe70);
                    local_71 = 0;
                  }
                  if ((((local_29 & 1) == 0) && ((opt_confirm_conf & 1U) != 0)) &&
                     ((local_71 & 1) != 0)) {
                    malloc_printf("<jemalloc>: Set conf value: %.*s:%.*s\n",local_68 & 0xffffffff,
                                  local_58,local_70 & 0xffffffff,local_60);
                  }
                }
                else if ((local_29 & 1) == 0) {
                  malloc_conf_error((char *)in_stack_fffffffffffffe90,
                                    (char *)CONCAT44(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88),
                                    (size_t)in_stack_fffffffffffffe80,
                                    (char *)CONCAT17(bVar8,CONCAT16(in_stack_fffffffffffffe7e,
                                                                    in_stack_fffffffffffffe78)),
                                    (size_t)in_stack_fffffffffffffe70);
                  local_71 = 0;
                }
              }
            }
          }
        }
      }
      if (((opt_abort_conf & 1U) != 0) && ((had_conf_error & 1U) != 0)) {
        malloc_abort_invalid_conf();
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

static void
malloc_conf_init_helper(sc_data_t *sc_data, unsigned bin_shard_sizes[SC_NBINS],
    bool initial_call, const char *opts_cache[MALLOC_CONF_NSOURCES],
    char buf[PATH_MAX + 1]) {
	static const char *opts_explain[MALLOC_CONF_NSOURCES] = {
		"string specified via --with-malloc-conf",
		"string pointed to by the global variable malloc_conf",
		"\"name\" of the file referenced by the symbolic link named "
		    "/etc/malloc.conf",
		"value of the environment variable MALLOC_CONF"
	};
	unsigned i;
	const char *opts, *k, *v;
	size_t klen, vlen;

	for (i = 0; i < MALLOC_CONF_NSOURCES; i++) {
		/* Get runtime configuration. */
		if (initial_call) {
			opts_cache[i] = obtain_malloc_conf(i, buf);
		}
		opts = opts_cache[i];
		if (!initial_call && opt_confirm_conf) {
			malloc_printf(
			    "<jemalloc>: malloc_conf #%u (%s): \"%s\"\n",
			    i + 1, opts_explain[i], opts != NULL ? opts : "");
		}
		if (opts == NULL) {
			continue;
		}

		while (*opts != '\0' && !malloc_conf_next(&opts, &k, &klen, &v,
		    &vlen)) {

#define CONF_ERROR(msg, k, klen, v, vlen)				\
			if (!initial_call) {				\
				malloc_conf_error(			\
				    msg, k, klen, v, vlen);		\
				cur_opt_valid = false;			\
			}
#define CONF_CONTINUE	{						\
				if (!initial_call && opt_confirm_conf	\
				    && cur_opt_valid) {			\
					malloc_printf("<jemalloc>: Set "\
					    "conf value: %.*s:%.*s\n",	\
					    (int)klen, k, (int)vlen, v);\
				}					\
				continue;				\
			}
#define CONF_MATCH(n)							\
	(sizeof(n)-1 == klen && strncmp(n, k, klen) == 0)
#define CONF_MATCH_VALUE(n)						\
	(sizeof(n)-1 == vlen && strncmp(n, v, vlen) == 0)
#define CONF_HANDLE_BOOL(o, n)						\
			if (CONF_MATCH(n)) {				\
				if (CONF_MATCH_VALUE("true")) {		\
					o = true;			\
				} else if (CONF_MATCH_VALUE("false")) {	\
					o = false;			\
				} else {				\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				}					\
				CONF_CONTINUE;				\
			}
      /*
       * One of the CONF_MIN macros below expands, in one of the use points,
       * to "unsigned integer < 0", which is always false, triggering the
       * GCC -Wtype-limits warning, which we disable here and re-enable below.
       */
      JEMALLOC_DIAGNOSTIC_PUSH
      JEMALLOC_DIAGNOSTIC_IGNORE_TYPE_LIMITS

#define CONF_DONT_CHECK_MIN(um, min)	false
#define CONF_CHECK_MIN(um, min)	((um) < (min))
#define CONF_DONT_CHECK_MAX(um, max)	false
#define CONF_CHECK_MAX(um, max)	((um) > (max))
#define CONF_HANDLE_T_U(t, o, n, min, max, check_min, check_max, clip)	\
			if (CONF_MATCH(n)) {				\
				uintmax_t um;				\
				char *end;				\
									\
				set_errno(0);				\
				um = malloc_strtoumax(v, &end, 0);	\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (clip) {			\
					if (check_min(um, (t)(min))) {	\
						o = (t)(min);		\
					} else if (			\
					    check_max(um, (t)(max))) {	\
						o = (t)(max);		\
					} else {			\
						o = (t)um;		\
					}				\
				} else {				\
					if (check_min(um, (t)(min)) ||	\
					    check_max(um, (t)(max))) {	\
						CONF_ERROR(		\
						    "Out-of-range "	\
						    "conf value",	\
						    k, klen, v, vlen);	\
					} else {			\
						o = (t)um;		\
					}				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_UNSIGNED(o, n, min, max, check_min, check_max,	\
    clip)								\
			CONF_HANDLE_T_U(unsigned, o, n, min, max,	\
			    check_min, check_max, clip)
#define CONF_HANDLE_SIZE_T(o, n, min, max, check_min, check_max, clip)	\
			CONF_HANDLE_T_U(size_t, o, n, min, max,		\
			    check_min, check_max, clip)
#define CONF_HANDLE_SSIZE_T(o, n, min, max)				\
			if (CONF_MATCH(n)) {				\
				long l;					\
				char *end;				\
									\
				set_errno(0);				\
				l = strtol(v, &end, 0);			\
				if (get_errno() != 0 || (uintptr_t)end -\
				    (uintptr_t)v != vlen) {		\
					CONF_ERROR("Invalid conf value",\
					    k, klen, v, vlen);		\
				} else if (l < (ssize_t)(min) || l >	\
				    (ssize_t)(max)) {			\
					CONF_ERROR(			\
					    "Out-of-range conf value",	\
					    k, klen, v, vlen);		\
				} else {				\
					o = l;				\
				}					\
				CONF_CONTINUE;				\
			}
#define CONF_HANDLE_CHAR_P(o, n, d)					\
			if (CONF_MATCH(n)) {				\
				size_t cpylen = (vlen <=		\
				    sizeof(o)-1) ? vlen :		\
				    sizeof(o)-1;			\
				strncpy(o, v, cpylen);			\
				o[cpylen] = '\0';			\
				CONF_CONTINUE;				\
			}

			bool cur_opt_valid = true;

			CONF_HANDLE_BOOL(opt_confirm_conf, "confirm_conf")
			if (initial_call) {
				continue;
			}

			CONF_HANDLE_BOOL(opt_abort, "abort")
			CONF_HANDLE_BOOL(opt_abort_conf, "abort_conf")
			if (strncmp("metadata_thp", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < metadata_thp_mode_limit; i++) {
					if (strncmp(metadata_thp_mode_names[i],
					    v, vlen) == 0) {
						opt_metadata_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_retain, "retain")
			if (strncmp("dss", k, klen) == 0) {
				int i;
				bool match = false;
				for (i = 0; i < dss_prec_limit; i++) {
					if (strncmp(dss_prec_names[i], v, vlen)
					    == 0) {
						if (extent_dss_prec_set(i)) {
							CONF_ERROR(
							    "Error setting dss",
							    k, klen, v, vlen);
						} else {
							opt_dss =
							    dss_prec_names[i];
							match = true;
							break;
						}
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_UNSIGNED(opt_narenas, "narenas", 1,
			    UINT_MAX, CONF_CHECK_MIN, CONF_DONT_CHECK_MAX,
			    false)
			if (CONF_MATCH("bin_shards")) {
				const char *bin_shards_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t size_start;
					size_t size_end;
					size_t nshards;
					bool err = malloc_conf_multi_sizes_next(
					    &bin_shards_segment_cur, &vlen_left,
					    &size_start, &size_end, &nshards);
					if (err || bin_update_shard_size(
					    bin_shard_sizes, size_start,
					    size_end, nshards)) {
						CONF_ERROR(
						    "Invalid settings for "
						    "bin_shards", k, klen, v,
						    vlen);
						break;
					}
				} while (vlen_left > 0);
				CONF_CONTINUE;
			}
			CONF_HANDLE_SSIZE_T(opt_dirty_decay_ms,
			    "dirty_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_SSIZE_T(opt_muzzy_decay_ms,
			    "muzzy_decay_ms", -1, NSTIME_SEC_MAX * KQU(1000) <
			    QU(SSIZE_MAX) ? NSTIME_SEC_MAX * KQU(1000) :
			    SSIZE_MAX);
			CONF_HANDLE_BOOL(opt_stats_print, "stats_print")
			if (CONF_MATCH("stats_print_opts")) {
				init_opt_stats_print_opts(v, vlen);
				CONF_CONTINUE;
			}
			if (config_fill) {
				if (CONF_MATCH("junk")) {
					if (CONF_MATCH_VALUE("true")) {
						opt_junk = "true";
						opt_junk_alloc = opt_junk_free =
						    true;
					} else if (CONF_MATCH_VALUE("false")) {
						opt_junk = "false";
						opt_junk_alloc = opt_junk_free =
						    false;
					} else if (CONF_MATCH_VALUE("alloc")) {
						opt_junk = "alloc";
						opt_junk_alloc = true;
						opt_junk_free = false;
					} else if (CONF_MATCH_VALUE("free")) {
						opt_junk = "free";
						opt_junk_alloc = false;
						opt_junk_free = true;
					} else {
						CONF_ERROR(
						    "Invalid conf value",
						    k, klen, v, vlen);
					}
					CONF_CONTINUE;
				}
				CONF_HANDLE_BOOL(opt_zero, "zero")
			}
			if (config_utrace) {
				CONF_HANDLE_BOOL(opt_utrace, "utrace")
			}
			if (config_xmalloc) {
				CONF_HANDLE_BOOL(opt_xmalloc, "xmalloc")
			}
			CONF_HANDLE_BOOL(opt_tcache, "tcache")
			CONF_HANDLE_SSIZE_T(opt_lg_tcache_max, "lg_tcache_max",
			    -1, (sizeof(size_t) << 3) - 1)

			/*
			 * The runtime option of oversize_threshold remains
			 * undocumented.  It may be tweaked in the next major
			 * release (6.0).  The default value 8M is rather
			 * conservative / safe.  Tuning it further down may
			 * improve fragmentation a bit more, but may also cause
			 * contention on the huge arena.
			 */
			CONF_HANDLE_SIZE_T(opt_oversize_threshold,
			    "oversize_threshold", 0, SC_LARGE_MAXCLASS,
			    CONF_DONT_CHECK_MIN, CONF_CHECK_MAX, false)
			CONF_HANDLE_SIZE_T(opt_lg_extent_max_active_fit,
			    "lg_extent_max_active_fit", 0,
			    (sizeof(size_t) << 3), CONF_DONT_CHECK_MIN,
			    CONF_CHECK_MAX, false)

			if (strncmp("percpu_arena", k, klen) == 0) {
				bool match = false;
				for (int i = percpu_arena_mode_names_base; i <
				    percpu_arena_mode_names_limit; i++) {
					if (strncmp(percpu_arena_mode_names[i],
					    v, vlen) == 0) {
						if (!have_percpu_arena) {
							CONF_ERROR(
							    "No getcpu support",
							    k, klen, v, vlen);
						}
						opt_percpu_arena = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_HANDLE_BOOL(opt_background_thread,
			    "background_thread");
			CONF_HANDLE_SIZE_T(opt_max_background_threads,
					   "max_background_threads", 1,
					   opt_max_background_threads,
					   CONF_CHECK_MIN, CONF_CHECK_MAX,
					   true);
			if (CONF_MATCH("slab_sizes")) {
				bool err;
				const char *slab_size_segment_cur = v;
				size_t vlen_left = vlen;
				do {
					size_t slab_start;
					size_t slab_end;
					size_t pgs;
					err = malloc_conf_multi_sizes_next(
					    &slab_size_segment_cur,
					    &vlen_left, &slab_start, &slab_end,
					    &pgs);
					if (!err) {
						sc_data_update_slab_size(
						    sc_data, slab_start,
						    slab_end, (int)pgs);
					} else {
						CONF_ERROR("Invalid settings "
						    "for slab_sizes",
						    k, klen, v, vlen);
					}
				} while (!err && vlen_left > 0);
				CONF_CONTINUE;
			}
			if (config_prof) {
				CONF_HANDLE_BOOL(opt_prof, "prof")
				CONF_HANDLE_CHAR_P(opt_prof_prefix,
				    "prof_prefix", "jeprof")
				CONF_HANDLE_BOOL(opt_prof_active, "prof_active")
				CONF_HANDLE_BOOL(opt_prof_thread_active_init,
				    "prof_thread_active_init")
				CONF_HANDLE_SIZE_T(opt_lg_prof_sample,
				    "lg_prof_sample", 0, (sizeof(uint64_t) << 3)
				    - 1, CONF_DONT_CHECK_MIN, CONF_CHECK_MAX,
				    true)
				CONF_HANDLE_BOOL(opt_prof_accum, "prof_accum")
				CONF_HANDLE_SSIZE_T(opt_lg_prof_interval,
				    "lg_prof_interval", -1,
				    (sizeof(uint64_t) << 3) - 1)
				CONF_HANDLE_BOOL(opt_prof_gdump, "prof_gdump")
				CONF_HANDLE_BOOL(opt_prof_final, "prof_final")
				CONF_HANDLE_BOOL(opt_prof_leak, "prof_leak")
				CONF_HANDLE_BOOL(opt_prof_log, "prof_log")
			}
			if (config_log) {
				if (CONF_MATCH("log")) {
					size_t cpylen = (
					    vlen <= sizeof(log_var_names) ?
					    vlen : sizeof(log_var_names) - 1);
					strncpy(log_var_names, v, cpylen);
					log_var_names[cpylen] = '\0';
					CONF_CONTINUE;
				}
			}
			if (CONF_MATCH("thp")) {
				bool match = false;
				for (int i = 0; i < thp_mode_names_limit; i++) {
					if (strncmp(thp_mode_names[i],v, vlen)
					    == 0) {
						if (!have_madvise_huge) {
							CONF_ERROR(
							    "No THP support",
							    k, klen, v, vlen);
						}
						opt_thp = i;
						match = true;
						break;
					}
				}
				if (!match) {
					CONF_ERROR("Invalid conf value",
					    k, klen, v, vlen);
				}
				CONF_CONTINUE;
			}
			CONF_ERROR("Invalid conf pair", k, klen, v, vlen);
#undef CONF_ERROR
#undef CONF_CONTINUE
#undef CONF_MATCH
#undef CONF_MATCH_VALUE
#undef CONF_HANDLE_BOOL
#undef CONF_DONT_CHECK_MIN
#undef CONF_CHECK_MIN
#undef CONF_DONT_CHECK_MAX
#undef CONF_CHECK_MAX
#undef CONF_HANDLE_T_U
#undef CONF_HANDLE_UNSIGNED
#undef CONF_HANDLE_SIZE_T
#undef CONF_HANDLE_SSIZE_T
#undef CONF_HANDLE_CHAR_P
    /* Re-enable diagnostic "-Wtype-limits" */
    JEMALLOC_DIAGNOSTIC_POP
		}
		if (opt_abort_conf && had_conf_error) {
			malloc_abort_invalid_conf();
		}
	}
	atomic_store_b(&log_init_done, true, ATOMIC_RELEASE);
}